

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgPrettyPrinter.cpp
# Opt level: O0

void __thiscall rsg::PrettyPrinter::processToken(PrettyPrinter *this,Token *token)

{
  ostream *poVar1;
  bool bVar2;
  Type TVar3;
  long lVar4;
  char *pcVar5;
  bool local_a9;
  char *tokenStr;
  int local_80;
  int local_7c;
  int i;
  float local_44;
  undefined1 local_40 [8];
  string f;
  bool prevIsIdentifierChar;
  Token *token_local;
  PrettyPrinter *this_local;
  
  lVar4 = std::__cxx11::string::length();
  local_a9 = false;
  if (lVar4 != 0) {
    std::__cxx11::string::length();
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)this);
    local_a9 = isIdentifierChar(*pcVar5);
  }
  f.field_2._M_local_buf[0xf] = local_a9;
  TVar3 = Token::getType(token);
  if (TVar3 == IDENTIFIER) {
    if ((f.field_2._M_local_buf[0xf] & 1U) != 0) {
      std::__cxx11::string::operator+=((string *)this," ");
    }
    pcVar5 = Token::getIdentifier(token);
    std::__cxx11::string::operator+=((string *)this,pcVar5);
  }
  else if (TVar3 == FLOAT_LITERAL) {
    local_44 = Token::getFloat(token);
    de::toString<float>((string *)local_40,&local_44);
    lVar4 = std::__cxx11::string::find((char)local_40,0x2e);
    if (lVar4 == -1) {
      std::__cxx11::string::operator+=((string *)local_40,".0");
    }
    std::__cxx11::string::operator+=((string *)this,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  else if (TVar3 == INT_LITERAL) {
    local_7c = Token::getInt(token);
    de::toString<int>((string *)&i,&local_7c);
    std::__cxx11::string::operator+=((string *)this,(string *)&i);
    std::__cxx11::string::~string((string *)&i);
  }
  else if (TVar3 == BOOL_LITERAL) {
    bVar2 = Token::getBool(token);
    pcVar5 = "false";
    if (bVar2) {
      pcVar5 = "true";
    }
    std::__cxx11::string::operator+=((string *)this,pcVar5);
  }
  else if (TVar3 == INDENT_INC) {
    this->m_indentDepth = this->m_indentDepth + 1;
  }
  else if (TVar3 == INDENT_DEC) {
    this->m_indentDepth = this->m_indentDepth + -1;
  }
  else if (TVar3 == NEWLINE) {
    for (local_80 = 0; local_80 < this->m_indentDepth; local_80 = local_80 + 1) {
      std::operator<<((ostream *)this->m_str,"\t");
    }
    poVar1 = (ostream *)this->m_str;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tokenStr,
                   &this->m_line,"\n");
    std::operator<<(poVar1,(string *)&tokenStr);
    std::__cxx11::string::~string((string *)&tokenStr);
    std::__cxx11::string::operator=((string *)this,"");
  }
  else {
    TVar3 = Token::getType(token);
    pcVar5 = getSimpleTokenStr(TVar3);
    if (((f.field_2._M_local_buf[0xf] & 1U) != 0) && (bVar2 = isIdentifierChar(*pcVar5), bVar2)) {
      std::__cxx11::string::operator+=((string *)this," ");
    }
    std::__cxx11::string::operator+=((string *)this,pcVar5);
  }
  return;
}

Assistant:

void PrettyPrinter::processToken (const Token& token)
{
	bool prevIsIdentifierChar = m_line.length() > 0 && isIdentifierChar(m_line[m_line.length()-1]);

	switch (token.getType())
	{
		case Token::IDENTIFIER:
			if (prevIsIdentifierChar)
				m_line += " ";
			m_line += token.getIdentifier();
			break;

		case Token::FLOAT_LITERAL:
		{
			std::string f = de::toString(token.getFloat());
			if (f.find('.') == std::string::npos)
				f += ".0"; // Make sure value parses as float
			m_line += f;
			break;
		}

		case Token::INT_LITERAL:
			m_line += de::toString(token.getInt());
			break;

		case Token::BOOL_LITERAL:
			m_line += (token.getBool() ? "true" : "false");
			break;

		case Token::INDENT_INC:
			m_indentDepth += 1;
			break;

		case Token::INDENT_DEC:
			m_indentDepth -= 1;
			break;

		case Token::NEWLINE:
			// Indent
			for (int i = 0; i < m_indentDepth; i++)
				m_str << "\t";

			// Flush line to source
			m_str << m_line + "\n";
			m_line = "";
			break;

		default:
		{
			const char* tokenStr = getSimpleTokenStr(token.getType());
			if (prevIsIdentifierChar && isIdentifierChar(tokenStr[0]))
				m_line += " ";
			m_line += tokenStr;
			break;
		}
	}
}